

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

uint32 * __thiscall Js::IndexPropertyDescriptorMap::CopyIndexList(IndexPropertyDescriptorMap *this)

{
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  uint *puVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  Recycler *this_00;
  undefined4 *puVar7;
  long lVar8;
  uint32 *puVar9;
  size_t size;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pBVar1 = (this->indexPropertyMap).ptr;
  data.plusSize = (size_t)(pBVar1->count - pBVar1->freeCount);
  local_50 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9b91433;
  data.filename._0_4_ = 0x1f;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  pBVar1 = (this->indexPropertyMap).ptr;
  iVar5 = pBVar1->count - pBVar1->freeCount;
  if (iVar5 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    puVar9 = (uint32 *)&DAT_00000008;
  }
  else {
    size = 0xffffffffffffffff;
    if (-1 < iVar5) {
      size = (long)iVar5 * 4;
    }
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00dc4d92;
      *puVar7 = 0;
    }
    if (size == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                  "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar4) goto LAB_00dc4d92;
      *puVar7 = 0;
    }
    puVar9 = (uint32 *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,size);
    if (puVar9 == (uint32 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00dc4d92:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
  }
  pBVar1 = (this->indexPropertyMap).ptr;
  if (0 < pBVar1->count - pBVar1->freeCount) {
    puVar2 = (this->indexList).ptr;
    lVar8 = 0;
    do {
      puVar9[lVar8] = puVar2[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 < pBVar1->count - pBVar1->freeCount);
  }
  return puVar9;
}

Assistant:

uint32 * IndexPropertyDescriptorMap::CopyIndexList() const
    {
        uint32 * newList = RecyclerNewArrayLeaf(recycler, uint32, Count());
        for (int i = 0; i < Count(); i++)
        {
            newList[i] = this->indexList[i];
        }
        return newList;
    }